

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameParentFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  int iVar1;
  char *z_00;
  char *pcVar2;
  char *local_90;
  char *local_80;
  char *zOut;
  char *zParent;
  int token;
  int n;
  uchar *z;
  uchar *zNew;
  uchar *zOld;
  uchar *zInput;
  char *zResult;
  char *zOutput;
  sqlite3 *db;
  sqlite3_value **argv_local;
  sqlite3_context *psStack_10;
  int NotUsed_local;
  sqlite3_context *context_local;
  
  db = (sqlite3 *)argv;
  argv_local._4_4_ = NotUsed;
  psStack_10 = context;
  zOutput = (char *)sqlite3_context_db_handle(context);
  zResult = (char *)0x0;
  zOld = sqlite3_value_text((sqlite3_value *)db->pVfs);
  zNew = sqlite3_value_text((sqlite3_value *)db->pVdbe);
  z = sqlite3_value_text((sqlite3_value *)db->pDfltColl);
  for (_token = zOld; *_token != '\0'; _token = _token + zParent._4_4_) {
    zParent._4_4_ = sqlite3GetToken(_token,(int *)&zParent);
    if ((int)zParent == 0x66) {
      do {
        _token = _token + zParent._4_4_;
        zParent._4_4_ = sqlite3GetToken(_token,(int *)&zParent);
      } while ((int)zParent == 0x95);
      z_00 = sqlite3DbStrNDup((sqlite3 *)zOutput,(char *)_token,zParent._4_4_);
      if (z_00 == (char *)0x0) break;
      sqlite3Dequote(z_00);
      iVar1 = sqlite3_stricmp((char *)zNew,z_00);
      if (iVar1 == 0) {
        if (zResult == (char *)0x0) {
          local_80 = "";
        }
        else {
          local_80 = zResult;
        }
        pcVar2 = sqlite3MPrintf((sqlite3 *)zOutput,"%s%.*s\"%w\"",local_80,(long)_token - (long)zOld
                                ,zOld,z);
        sqlite3DbFree((sqlite3 *)zOutput,zResult);
        zOld = _token + zParent._4_4_;
        zResult = pcVar2;
      }
      sqlite3DbFree((sqlite3 *)zOutput,z_00);
    }
  }
  if (zResult == (char *)0x0) {
    local_90 = "";
  }
  else {
    local_90 = zResult;
  }
  zInput = (uchar *)sqlite3MPrintf((sqlite3 *)zOutput,"%s%s",local_90,zOld);
  sqlite3_result_text(psStack_10,(char *)zInput,-1,sqlite3MallocSize);
  sqlite3DbFree((sqlite3 *)zOutput,zResult);
  return;
}

Assistant:

static void renameParentFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  char *zOutput = 0;
  char *zResult;
  unsigned char const *zInput = sqlite3_value_text(argv[0]);
  unsigned char const *zOld = sqlite3_value_text(argv[1]);
  unsigned char const *zNew = sqlite3_value_text(argv[2]);

  unsigned const char *z;         /* Pointer to token */
  int n;                          /* Length of token z */
  int token;                      /* Type of token */

  UNUSED_PARAMETER(NotUsed);
  for(z=zInput; *z; z=z+n){
    n = sqlite3GetToken(z, &token);
    if( token==TK_REFERENCES ){
      char *zParent;
      do {
        z += n;
        n = sqlite3GetToken(z, &token);
      }while( token==TK_SPACE );

      zParent = sqlite3DbStrNDup(db, (const char *)z, n);
      if( zParent==0 ) break;
      sqlite3Dequote(zParent);
      if( 0==sqlite3StrICmp((const char *)zOld, zParent) ){
        char *zOut = sqlite3MPrintf(db, "%s%.*s\"%w\"", 
            (zOutput?zOutput:""), z-zInput, zInput, (const char *)zNew
        );
        sqlite3DbFree(db, zOutput);
        zOutput = zOut;
        zInput = &z[n];
      }
      sqlite3DbFree(db, zParent);
    }
  }

  zResult = sqlite3MPrintf(db, "%s%s", (zOutput?zOutput:""), zInput), 
  sqlite3_result_text(context, zResult, -1, SQLITE_DYNAMIC);
  sqlite3DbFree(db, zOutput);
}